

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O0

StorageValueIgnorer<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *
supermap::io::
DeserializeHelper<supermap::StorageValueIgnorer<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_void>
::deserialize(istream *is)

{
  ulong uVar1;
  IOException *this;
  long in_RSI;
  StorageValueIgnorer<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *in_RDI;
  istream *in_stack_ffffffffffffffb0;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  deserialize<supermap::Key<128ul>,void>(in_stack_ffffffffffffffb0);
  std::istream::seekg(in_RSI,0x1000);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    return in_RDI;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  supermap::IOException::IOException(this,local_28);
  __cxa_throw(this,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

static StorageValueIgnorer<Key, Value> deserialize(std::istream &is) {
        StorageValueIgnorer<Key, Value> svi{io::deserialize<Key>(is)};
        is.seekg(FixedDeserializedSizeRegister<Value>::exactDeserializedSize, std::ios_base::cur);
        if (is.fail()) {
            throw IOException("StorageValueIgnorer deserialization fail: seekg failed");
        }
        return svi;
    }